

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O0

void __thiscall QMakeParser::bogusTest(QMakeParser *this,ushort **tokPtr,QString *msg)

{
  bool bVar1;
  QMakeParser *in_RDX;
  QMakeParser *in_RDI;
  QString *in_stack_ffffffffffffffd8;
  
  bVar1 = QString::isEmpty((QString *)0x31519b);
  if (!bVar1) {
    parseError(in_RDI,in_stack_ffffffffffffffd8);
  }
  flushScopes(in_RDX,(ushort **)in_RDI);
  in_RDI->m_operator = NoOperator;
  in_RDI->m_invert = 0;
  in_RDI->m_state = StCond;
  in_RDI->m_canElse = true;
  return;
}

Assistant:

void QMakeParser::bogusTest(ushort *&tokPtr, const QString &msg)
{
    if (!msg.isEmpty())
        parseError(msg);
    flushScopes(tokPtr);
    m_operator = NoOperator;
    m_invert = 0;
    m_state = StCond;
    m_canElse = true;
}